

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_utils.c
# Opt level: O2

int BuildHuffmanTable(HuffmanCode *root_table,int root_bits,int *code_lengths,int code_lengths_size,
                     uint16_t *sorted)

{
  ushort uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  HuffmanCode HVar6;
  uint uVar7;
  uint key;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  HuffmanCode *pHVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar28;
  undefined1 auVar27 [16];
  HuffmanCode *local_e8;
  int count [16];
  int offset [16];
  
  bVar2 = (byte)root_bits;
  iVar21 = 1;
  iVar14 = 1 << (bVar2 & 0x1f);
  count[0xc] = 0;
  count[0xd] = 0;
  count[0xe] = 0;
  count[0xf] = 0;
  count[8] = 0;
  count[9] = 0;
  count[10] = 0;
  count[0xb] = 0;
  count[4] = 0;
  count[5] = 0;
  count[6] = 0;
  count[7] = 0;
  count[0] = 0;
  count[1] = 0;
  count[2] = 0;
  count[3] = 0;
  uVar10 = 0;
  uVar18 = 0;
  if (0 < code_lengths_size) {
    uVar18 = (ulong)(uint)code_lengths_size;
  }
  for (; uVar18 != uVar10; uVar10 = uVar10 + 1) {
    if (0xf < (long)code_lengths[uVar10]) goto LAB_001246fd;
    count[code_lengths[uVar10]] = count[code_lengths[uVar10]] + 1;
  }
  if (count[0] == code_lengths_size) {
LAB_001246fd:
    iVar14 = 0;
  }
  else {
    offset[1] = 0;
    for (lVar23 = 0; lVar23 != 0xe; lVar23 = lVar23 + 1) {
      if (1 << ((char)lVar23 + 1U & 0x1f) < count[lVar23 + 1]) goto LAB_001246fd;
      offset[lVar23 + 2] = count[lVar23 + 1] + offset[lVar23 + 1];
    }
    for (uVar10 = 0; auVar5 = _DAT_001a9c20, auVar4 = _DAT_001a8680, auVar3 = _DAT_001a74d0,
        uVar18 != uVar10; uVar10 = uVar10 + 1) {
      lVar23 = (long)code_lengths[uVar10];
      if (0 < lVar23) {
        iVar28 = offset[lVar23];
        if (sorted == (uint16_t *)0x0) {
          offset[lVar23] = iVar28 + 1;
        }
        else {
          if (code_lengths_size <= iVar28) goto LAB_001246fd;
          offset[lVar23] = iVar28 + 1;
          sorted[iVar28] = (uint16_t)uVar10;
        }
      }
    }
    if (offset[0xf] == 1) {
      if (sorted != (uint16_t *)0x0) {
        HVar6 = (HuffmanCode)((uint)*sorted << 0x10);
        lVar12 = (long)iVar14;
        lVar23 = 1;
        if (1 < lVar12) {
          lVar23 = lVar12;
        }
        lVar19 = lVar23 + -1;
        auVar25._8_4_ = (int)lVar19;
        auVar25._0_8_ = lVar19;
        auVar25._12_4_ = (int)((ulong)lVar19 >> 0x20);
        pHVar13 = root_table + lVar12 + -1;
        uVar10 = 0;
        auVar25 = auVar25 ^ _DAT_001a8680;
        do {
          auVar26._8_4_ = (int)uVar10;
          auVar26._0_8_ = uVar10;
          auVar26._12_4_ = (int)(uVar10 >> 0x20);
          auVar27 = (auVar26 | auVar3) ^ auVar4;
          iVar21 = auVar25._4_4_;
          if ((bool)(~(auVar27._4_4_ == iVar21 && auVar25._0_4_ < auVar27._0_4_ ||
                      iVar21 < auVar27._4_4_) & 1)) {
            *pHVar13 = HVar6;
          }
          if ((auVar27._12_4_ != auVar25._12_4_ || auVar27._8_4_ <= auVar25._8_4_) &&
              auVar27._12_4_ <= auVar25._12_4_) {
            pHVar13[-1] = HVar6;
          }
          auVar26 = (auVar26 | auVar5) ^ auVar4;
          iVar28 = auVar26._4_4_;
          if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar26._0_4_ <= auVar25._0_4_)) {
            pHVar13[-2] = HVar6;
            pHVar13[-3] = HVar6;
          }
          uVar10 = uVar10 + 4;
          pHVar13 = pHVar13 + -4;
        } while (((int)lVar23 + 3U & 0xfffffffc) != uVar10);
      }
    }
    else {
      uVar7 = iVar14 - 1;
      key = 0;
      iVar28 = 0;
      if (0 < root_bits) {
        iVar28 = root_bits;
      }
      iVar15 = 2;
      uVar18 = 0;
      iVar17 = 1;
      for (uVar10 = 1; uVar10 != iVar28 + 1; uVar10 = uVar10 + 1) {
        iVar22 = count[uVar10];
        iVar8 = iVar17 * 2 - iVar22;
        if (iVar8 < 0) goto LAB_001246fd;
        if (root_table != (HuffmanCode *)0x0) {
          uVar18 = (ulong)(int)uVar18;
          while (0 < iVar22) {
            uVar1 = sorted[uVar18];
            iVar16 = iVar14;
            do {
              iVar20 = iVar16 - iVar15;
              iVar16 = iVar16 - iVar15;
              root_table[(ulong)key + (long)iVar20] =
                   (HuffmanCode)((uint)uVar1 << 0x10 | (uint)uVar10 & 0xff);
            } while (0 < iVar16);
            uVar18 = uVar18 + 1;
            key = GetNextKey(key,(uint)uVar10);
            iVar22 = iVar22 + -1;
            count[uVar10] = iVar22;
          }
        }
        iVar21 = iVar21 + iVar17 * 2;
        iVar15 = iVar15 * 2;
        iVar17 = iVar8;
      }
      lVar23 = (long)root_bits;
      iVar15 = 2;
      uVar24 = 0xffffffff;
      local_e8 = root_table;
      iVar28 = iVar14;
      while (lVar23 < 0xf) {
        lVar23 = lVar23 + 1;
        iVar22 = count[lVar23];
        iVar8 = iVar17 * 2 - iVar22;
        if (iVar8 < 0) goto LAB_001246fd;
        uVar9 = (int)lVar23 - root_bits;
        iVar21 = iVar21 + iVar17 * 2;
        while (0 < iVar22) {
          uVar11 = key & uVar7;
          if (uVar11 == uVar24) {
            uVar11 = uVar24;
            if (root_table != (HuffmanCode *)0x0) {
LAB_00124a7e:
              uVar1 = sorted[(int)uVar18];
              iVar17 = iVar14;
              do {
                iVar22 = iVar17 - iVar15;
                iVar17 = iVar17 - iVar15;
                local_e8[(ulong)(key >> (bVar2 & 0x1f)) + (long)iVar22] =
                     (HuffmanCode)((uint)uVar1 * 0x10000 + (uVar9 & 0xff));
              } while (0 < iVar17);
              uVar18 = (ulong)((int)uVar18 + 1);
              uVar24 = uVar11;
            }
          }
          else {
            lVar19 = (long)iVar14;
            iVar14 = 1 << ((byte)uVar9 & 0x1f);
            for (lVar12 = lVar23; lVar12 < 0xf; lVar12 = lVar12 + 1) {
              iVar17 = iVar14 - count[lVar12];
              if (iVar17 == 0 || iVar14 < count[lVar12]) goto LAB_00124a45;
              iVar14 = iVar17 * 2;
            }
            lVar12 = 0xf;
LAB_00124a45:
            iVar14 = 1 << ((uint8_t)lVar12 - bVar2 & 0x1f);
            iVar28 = iVar28 + iVar14;
            uVar24 = uVar11;
            if (root_table != (HuffmanCode *)0x0) {
              root_table[uVar11].bits = (uint8_t)lVar12;
              root_table[uVar11].value =
                   (short)((uint)((int)(local_e8 + lVar19) - (int)root_table) >> 2) - (short)uVar11;
              local_e8 = local_e8 + lVar19;
              goto LAB_00124a7e;
            }
          }
          key = GetNextKey(key,(int)lVar23);
          iVar22 = count[lVar23] + -1;
          count[lVar23] = iVar22;
        }
        iVar15 = iVar15 * 2;
        iVar17 = iVar8;
      }
      iVar14 = 0;
      if (iVar21 == offset[0xf] * 2 + -1) {
        iVar14 = iVar28;
      }
    }
  }
  return iVar14;
}

Assistant:

static int BuildHuffmanTable(HuffmanCode* const root_table, int root_bits,
                             const int code_lengths[], int code_lengths_size,
                             uint16_t sorted[]) {
  HuffmanCode* table = root_table;  // next available space in table
  int total_size = 1 << root_bits;  // total size root table + 2nd level table
  int len;                          // current code length
  int symbol;                       // symbol index in original or sorted table
  // number of codes of each length:
  int count[MAX_ALLOWED_CODE_LENGTH + 1] = { 0 };
  // offsets in sorted table for each length:
  int offset[MAX_ALLOWED_CODE_LENGTH + 1];

  assert(code_lengths_size != 0);
  assert(code_lengths != NULL);
  assert((root_table != NULL && sorted != NULL) ||
         (root_table == NULL && sorted == NULL));
  assert(root_bits > 0);

  // Build histogram of code lengths.
  for (symbol = 0; symbol < code_lengths_size; ++symbol) {
    if (code_lengths[symbol] > MAX_ALLOWED_CODE_LENGTH) {
      return 0;
    }
    ++count[code_lengths[symbol]];
  }

  // Error, all code lengths are zeros.
  if (count[0] == code_lengths_size) {
    return 0;
  }

  // Generate offsets into sorted symbol table by code length.
  offset[1] = 0;
  for (len = 1; len < MAX_ALLOWED_CODE_LENGTH; ++len) {
    if (count[len] > (1 << len)) {
      return 0;
    }
    offset[len + 1] = offset[len] + count[len];
  }

  // Sort symbols by length, by symbol order within each length.
  for (symbol = 0; symbol < code_lengths_size; ++symbol) {
    const int symbol_code_length = code_lengths[symbol];
    if (code_lengths[symbol] > 0) {
      if (sorted != NULL) {
        if(offset[symbol_code_length] >= code_lengths_size) {
            return 0;
        }
        sorted[offset[symbol_code_length]++] = symbol;
      } else {
        offset[symbol_code_length]++;
      }
    }
  }

  // Special case code with only one value.
  if (offset[MAX_ALLOWED_CODE_LENGTH] == 1) {
    if (sorted != NULL) {
      HuffmanCode code;
      code.bits = 0;
      code.value = (uint16_t)sorted[0];
      ReplicateValue(table, 1, total_size, code);
    }
    return total_size;
  }

  {
    int step;              // step size to replicate values in current table
    uint32_t low = 0xffffffffu;        // low bits for current root entry
    uint32_t mask = total_size - 1;    // mask for low bits
    uint32_t key = 0;      // reversed prefix code
    int num_nodes = 1;     // number of Huffman tree nodes
    int num_open = 1;      // number of open branches in current tree level
    int table_bits = root_bits;        // key length of current table
    int table_size = 1 << table_bits;  // size of current table
    symbol = 0;
    // Fill in root table.
    for (len = 1, step = 2; len <= root_bits; ++len, step <<= 1) {
      num_open <<= 1;
      num_nodes += num_open;
      num_open -= count[len];
      if (num_open < 0) {
        return 0;
      }
      if (root_table == NULL) continue;
      for (; count[len] > 0; --count[len]) {
        HuffmanCode code;
        code.bits = (uint8_t)len;
        code.value = (uint16_t)sorted[symbol++];
        ReplicateValue(&table[key], step, table_size, code);
        key = GetNextKey(key, len);
      }
    }

    // Fill in 2nd level tables and add pointers to root table.
    for (len = root_bits + 1, step = 2; len <= MAX_ALLOWED_CODE_LENGTH;
         ++len, step <<= 1) {
      num_open <<= 1;
      num_nodes += num_open;
      num_open -= count[len];
      if (num_open < 0) {
        return 0;
      }
      for (; count[len] > 0; --count[len]) {
        HuffmanCode code;
        if ((key & mask) != low) {
          if (root_table != NULL) table += table_size;
          table_bits = NextTableBitSize(count, len, root_bits);
          table_size = 1 << table_bits;
          total_size += table_size;
          low = key & mask;
          if (root_table != NULL) {
            root_table[low].bits = (uint8_t)(table_bits + root_bits);
            root_table[low].value = (uint16_t)((table - root_table) - low);
          }
        }
        if (root_table != NULL) {
          code.bits = (uint8_t)(len - root_bits);
          code.value = (uint16_t)sorted[symbol++];
          ReplicateValue(&table[key >> root_bits], step, table_size, code);
        }
        key = GetNextKey(key, len);
      }
    }

    // Check if tree is full.
    if (num_nodes != 2 * offset[MAX_ALLOWED_CODE_LENGTH] - 1) {
      return 0;
    }
  }

  return total_size;
}